

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeSingleSuccessorInfo::ReplaceSuccessor
          (PathTypeSingleSuccessorInfo *this,DynamicType *type,PathTypeSuccessorKey key,
          RecyclerWeakReference<Js::DynamicType> *typeWeakRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef_local;
  DynamicType *type_local;
  PathTypeSingleSuccessorInfo *this_local;
  PathTypeSuccessorKey key_local;
  
  this_local = (PathTypeSingleSuccessorInfo *)key;
  bVar2 = PathTypeSuccessorKey::operator==(&this->successorKey,(PathTypeSuccessorKey *)&this_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xab,"(successorKey == key)","successorKey == key");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>::operator=
            (&this->successorTypeWeakRef,typeWeakRef);
  return;
}

Assistant:

void PathTypeSingleSuccessorInfo::ReplaceSuccessor(DynamicType * type, const PathTypeSuccessorKey key, RecyclerWeakReference<DynamicType> * typeWeakRef)
    {
        Assert(successorKey == key);
        successorTypeWeakRef = typeWeakRef;
    }